

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecClass.c
# Opt level: O3

int Cec_ManSimSimulateRound(Cec_ManSim_t *p,Vec_Ptr_t *vInfoCis,Vec_Ptr_t *vInfoCos)

{
  Gia_Obj_t *pGVar1;
  void *pvVar2;
  Gia_Rpr_t *pGVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int *piVar7;
  uint *puVar8;
  Gia_Man_t *pGVar9;
  uint *puVar10;
  uint *puVar11;
  Vec_Int_t *pVVar12;
  long lVar13;
  uint uVar14;
  long lVar15;
  ulong uVar16;
  uint uVar17;
  
  if (p->nWordsOld != p->nWords) {
    Cec_ManSimMemRelink(p);
  }
  p->nMemsMax = 0;
  if (p->pScores != (int *)0x0) {
    free(p->pScores);
    p->pScores = (int *)0x0;
  }
  if (p->pBestState != (Abc_Cex_t *)0x0) {
    piVar7 = (int *)calloc((long)p->nWords << 5,4);
    p->pScores = piVar7;
  }
  p->vRefinedC->nSize = 0;
  if ((p->pAig->pObjs->Value != 0) && (puVar8 = Cec_ManSimSimRef(p,0), 0 < p->nWords)) {
    lVar13 = 0;
    do {
      puVar8[lVar13 + 1] = 0;
      lVar13 = lVar13 + 1;
    } while (lVar13 < p->nWords);
  }
  pGVar9 = p->pAig;
  uVar4 = 0;
  uVar17 = 0;
  if (1 < pGVar9->nObjs) {
    uVar17 = 0;
    lVar13 = 1;
    uVar4 = 0;
    do {
      pGVar1 = pGVar9->pObjs + lVar13;
      uVar14 = (uint)*(ulong *)pGVar1;
      iVar6 = (int)lVar13;
      if ((~uVar14 & 0x9fffffff) == 0) {
        if (pGVar1->Value == 0) {
          uVar4 = uVar4 + 1;
        }
        else {
          puVar8 = Cec_ManSimSimRef(p,iVar6);
          if (vInfoCis == (Vec_Ptr_t *)0x0) {
            uVar14 = uVar4;
            if (0 < p->nWords) {
              lVar15 = 0;
              do {
                uVar4 = Gia_ManRandom(0);
                puVar8[lVar15 + 1] = uVar4;
                lVar15 = lVar15 + 1;
              } while (lVar15 < p->nWords);
            }
          }
          else {
            if (((int)uVar4 < 0) || (vInfoCis->nSize <= (int)uVar4)) {
LAB_005cb900:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                            ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
            }
            uVar14 = uVar4 + 1;
            if (0 < p->nWords) {
              pvVar2 = vInfoCis->pArray[uVar4];
              lVar15 = 0;
              do {
                puVar8[lVar15 + 1] = *(uint *)((long)pvVar2 + lVar15 * 4);
                lVar15 = lVar15 + 1;
              } while (lVar15 < p->nWords);
            }
          }
          uVar4 = uVar14;
          *(byte *)(puVar8 + 1) = (byte)puVar8[1] & 0xfe;
LAB_005cb618:
          if (((uint)p->pAig->pReprs[lVar13] & 0xfffffff) == 0) {
            iVar5 = Cec_ManSimCompareConst(puVar8 + 1,p->nWords);
            if (iVar5 == 0) {
              *puVar8 = *puVar8 + 1;
              Vec_IntPush(p->vRefinedC,iVar6);
              if (p->pBestState != (Abc_Cex_t *)0x0) {
                Cec_ManSimCompareConstScore(puVar8 + 1,p->nWords,p->pScores);
              }
            }
          }
          pGVar9 = p->pAig;
          pGVar3 = pGVar9->pReprs;
          uVar14 = (uint)pGVar3[lVar13] & 0xfffffff;
          if (((uVar14 != 0xfffffff) && (uVar14 != 0)) || (0 < pGVar9->pNexts[lVar13])) {
            *puVar8 = *puVar8 + 1;
            uVar14 = (uint)pGVar3[lVar13] & 0xfffffff;
          }
          if (((uVar14 != 0) && (uVar14 != 0xfffffff)) &&
             (piVar7 = pGVar9->pNexts, piVar7[lVar13] == 0)) {
            p->vClassTemp->nSize = 0;
            uVar16 = (ulong)((uint)pGVar3[lVar13] & 0xfffffff);
            if (((~(uint)pGVar3[uVar16] & 0xfffffff) != 0) || (piVar7[uVar16] < 1)) {
              __assert_fail("Gia_ObjIsHead(p->pAig, Gia_ObjRepr(p->pAig, i))",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecClass.c"
                            ,0x2f3,
                            "int Cec_ManSimSimulateRound(Cec_ManSim_t *, Vec_Ptr_t *, Vec_Ptr_t *)")
              ;
            }
            if (((uint)pGVar3[lVar13] & 0xfffffff) == 0) {
              uVar14 = 0;
            }
            else {
              do {
                Vec_IntPush(p->vClassTemp,(int)uVar16);
                uVar14 = p->pAig->pNexts[(int)uVar16];
                uVar16 = (ulong)uVar14;
              } while (uVar14 != 0);
              uVar14 = (uint)p->pAig->pReprs[lVar13] & 0xfffffff;
            }
            Cec_ManSimClassRefineOne(p,uVar14);
            pVVar12 = p->vClassTemp;
            if (0 < pVVar12->nSize) {
              lVar15 = 0;
              do {
                Cec_ManSimSimDeref(p,pVVar12->pArray[lVar15]);
                lVar15 = lVar15 + 1;
                pVVar12 = p->vClassTemp;
              } while (lVar15 < pVVar12->nSize);
            }
          }
        }
      }
      else {
        if ((~uVar14 & 0x1fffffff) == 0 || -1 < (int)uVar14) {
          if (pGVar1->Value == 0) {
            __assert_fail("Gia_ObjValue(pObj)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecClass.c"
                          ,0x2c9,
                          "int Cec_ManSimSimulateRound(Cec_ManSim_t *, Vec_Ptr_t *, Vec_Ptr_t *)");
          }
          puVar8 = Cec_ManSimSimRef(p,iVar6);
          puVar10 = Cec_ManSimSimDeref(p,iVar6 - (*(uint *)pGVar1 & 0x1fffffff));
          puVar11 = Cec_ManSimSimDeref(p,iVar6 - (*(uint *)&pGVar1->field_0x4 & 0x1fffffff));
          uVar16 = *(ulong *)pGVar1;
          iVar5 = p->nWords;
          if (((uint)uVar16 >> 0x1d & 1) == 0) {
            if ((uVar16 >> 0x3d & 1) == 0) {
              if (0 < iVar5) {
                lVar15 = 0;
                do {
                  puVar8[lVar15 + 1] = puVar11[lVar15 + 1] & puVar10[lVar15 + 1];
                  lVar15 = lVar15 + 1;
                } while (lVar15 < p->nWords);
              }
            }
            else if (0 < iVar5) {
              lVar15 = 0;
              do {
                puVar8[lVar15 + 1] = ~puVar11[lVar15 + 1] & puVar10[lVar15 + 1];
                lVar15 = lVar15 + 1;
              } while (lVar15 < p->nWords);
            }
          }
          else if ((uVar16 >> 0x3d & 1) == 0) {
            if (0 < iVar5) {
              lVar15 = 0;
              do {
                puVar8[lVar15 + 1] = ~puVar10[lVar15 + 1] & puVar11[lVar15 + 1];
                lVar15 = lVar15 + 1;
              } while (lVar15 < p->nWords);
            }
          }
          else if (0 < iVar5) {
            lVar15 = 0;
            do {
              puVar8[lVar15 + 1] = ~(puVar11[lVar15 + 1] | puVar10[lVar15 + 1]);
              lVar15 = lVar15 + 1;
            } while (lVar15 < p->nWords);
          }
          goto LAB_005cb618;
        }
        puVar8 = Cec_ManSimSimDeref(p,iVar6 - (uVar14 & 0x1fffffff));
        if (vInfoCos != (Vec_Ptr_t *)0x0) {
          if (((int)uVar17 < 0) || (vInfoCos->nSize <= (int)uVar17)) goto LAB_005cb900;
          uVar16 = (ulong)uVar17;
          uVar17 = uVar17 + 1;
          pvVar2 = vInfoCos->pArray[uVar16];
          if ((pGVar1->field_0x3 & 0x20) == 0) {
            if (0 < p->nWords) {
              lVar15 = 0;
              do {
                *(uint *)((long)pvVar2 + lVar15 * 4) = puVar8[lVar15 + 1];
                lVar15 = lVar15 + 1;
              } while (lVar15 < p->nWords);
            }
          }
          else if (0 < p->nWords) {
            lVar15 = 0;
            do {
              *(uint *)((long)pvVar2 + lVar15 * 4) = ~puVar8[lVar15 + 1];
              lVar15 = lVar15 + 1;
            } while (lVar15 < p->nWords);
          }
        }
      }
      lVar13 = lVar13 + 1;
      pGVar9 = p->pAig;
    } while (lVar13 < pGVar9->nObjs);
  }
  pVVar12 = p->vRefinedC;
  if (p->pPars->fConstCorr == 0) {
    if (0 < pVVar12->nSize) {
      Cec_ManSimProcessRefined(p,pVVar12);
    }
  }
  else {
    if (0 < pVVar12->nSize) {
      lVar13 = 0;
      do {
        iVar6 = pVVar12->pArray[lVar13];
        pGVar3 = p->pAig->pReprs + iVar6;
        *pGVar3 = (Gia_Rpr_t)((uint)*pGVar3 | 0xfffffff);
        Cec_ManSimSimDeref(p,iVar6);
        lVar13 = lVar13 + 1;
        pVVar12 = p->vRefinedC;
      } while (lVar13 < pVVar12->nSize);
    }
    pVVar12->nSize = 0;
  }
  if ((vInfoCis != (Vec_Ptr_t *)0x0) && (uVar4 != p->pAig->vCis->nSize)) {
    __assert_fail("vInfoCis == NULL || iCiId == Gia_ManCiNum(p->pAig)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecClass.c"
                  ,0x307,"int Cec_ManSimSimulateRound(Cec_ManSim_t *, Vec_Ptr_t *, Vec_Ptr_t *)");
  }
  if ((vInfoCos != (Vec_Ptr_t *)0x0) && (uVar17 != p->pAig->vCos->nSize)) {
    __assert_fail("vInfoCos == NULL || iCoId == Gia_ManCoNum(p->pAig)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecClass.c"
                  ,0x308,"int Cec_ManSimSimulateRound(Cec_ManSim_t *, Vec_Ptr_t *, Vec_Ptr_t *)");
  }
  if (p->nMems != 1) {
    __assert_fail("p->nMems == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecClass.c"
                  ,0x309,"int Cec_ManSimSimulateRound(Cec_ManSim_t *, Vec_Ptr_t *, Vec_Ptr_t *)");
  }
  if (p->pPars->fVeryVerbose != 0) {
    Gia_ManEquivPrintClasses
              (p->pAig,0,(float)(p->pPars->nWords + 1) * (float)p->nMemsMax * 9.536743e-07);
  }
  if (p->pBestState != (Abc_Cex_t *)0x0) {
    Cec_ManSimFindBestPattern(p);
  }
  iVar6 = Cec_ManSimAnalyzeOutputs(p);
  return iVar6;
}

Assistant:

int Cec_ManSimSimulateRound( Cec_ManSim_t * p, Vec_Ptr_t * vInfoCis, Vec_Ptr_t * vInfoCos )
{
    Gia_Obj_t * pObj;
    unsigned * pRes0, * pRes1, * pRes;
    int i, k, w, Ent, iCiId = 0, iCoId = 0;
    // prepare internal storage
    if ( p->nWordsOld != p->nWords )
        Cec_ManSimMemRelink( p );
    p->nMemsMax = 0;
    // allocate score counters
    ABC_FREE( p->pScores );
    if ( p->pBestState )
        p->pScores = ABC_CALLOC( int, 32 * p->nWords );
    // simulate nodes
    Vec_IntClear( p->vRefinedC );
    if ( Gia_ObjValue(Gia_ManConst0(p->pAig)) )
    {
        pRes = Cec_ManSimSimRef( p, 0 );
        for ( w = 1; w <= p->nWords; w++ )
            pRes[w] = 0;
    }
    Gia_ManForEachObj1( p->pAig, pObj, i )
    {
        if ( Gia_ObjIsCi(pObj) ) 
        {
            if ( Gia_ObjValue(pObj) == 0 )
            {
                iCiId++;
                continue;
            }
            pRes = Cec_ManSimSimRef( p, i );
            if ( vInfoCis ) 
            {
                pRes0 = (unsigned *)Vec_PtrEntry( vInfoCis, iCiId++ );
                for ( w = 1; w <= p->nWords; w++ )
                    pRes[w] = pRes0[w-1];
            }
            else
            {
                for ( w = 1; w <= p->nWords; w++ )
                    pRes[w] = Gia_ManRandom( 0 );
            }
            // make sure the first pattern is always zero
            pRes[1] ^= (pRes[1] & 1);
            goto references;
        }
        if ( Gia_ObjIsCo(pObj) ) // co always has non-zero 1st fanin and zero 2nd fanin
        {
            pRes0 = Cec_ManSimSimDeref( p, Gia_ObjFaninId0(pObj,i) );
            if ( vInfoCos )
            {
                pRes = (unsigned *)Vec_PtrEntry( vInfoCos, iCoId++ );
                if ( Gia_ObjFaninC0(pObj) )
                    for ( w = 1; w <= p->nWords; w++ )
                        pRes[w-1] = ~pRes0[w];
                else 
                    for ( w = 1; w <= p->nWords; w++ )
                        pRes[w-1] = pRes0[w];
            }
            continue;
        }
        assert( Gia_ObjValue(pObj) );
        pRes  = Cec_ManSimSimRef( p, i );
        pRes0 = Cec_ManSimSimDeref( p, Gia_ObjFaninId0(pObj,i) );
        pRes1 = Cec_ManSimSimDeref( p, Gia_ObjFaninId1(pObj,i) );

//        Abc_Print( 1, "%d,%d  ", Gia_ObjValue( Gia_ObjFanin0(pObj) ), Gia_ObjValue( Gia_ObjFanin1(pObj) ) );

        if ( Gia_ObjFaninC0(pObj) )
        {
            if ( Gia_ObjFaninC1(pObj) )
                for ( w = 1; w <= p->nWords; w++ )
                    pRes[w] = ~(pRes0[w] | pRes1[w]);
            else
                for ( w = 1; w <= p->nWords; w++ )
                    pRes[w] = ~pRes0[w] & pRes1[w];
        }
        else
        {
            if ( Gia_ObjFaninC1(pObj) )
                for ( w = 1; w <= p->nWords; w++ )
                    pRes[w] = pRes0[w] & ~pRes1[w];
            else
                for ( w = 1; w <= p->nWords; w++ )
                    pRes[w] = pRes0[w] & pRes1[w];
        }

references:
        // if this node is candidate constant, collect it
        if ( Gia_ObjIsConst(p->pAig, i) && !Cec_ManSimCompareConst(pRes + 1, p->nWords) )
        {
            pRes[0]++;
            Vec_IntPush( p->vRefinedC, i );
            if ( p->pBestState )
                Cec_ManSimCompareConstScore( pRes + 1, p->nWords, p->pScores );
        }
        // if the node belongs to a class, save it
        if ( Gia_ObjIsClass(p->pAig, i) )
            pRes[0]++;
        // if this is the last node of the class, process it
        if ( Gia_ObjIsTail(p->pAig, i) )
        {
            Vec_IntClear( p->vClassTemp );
            Gia_ClassForEachObj( p->pAig, Gia_ObjRepr(p->pAig, i), Ent )
                Vec_IntPush( p->vClassTemp, Ent );
            Cec_ManSimClassRefineOne( p, Gia_ObjRepr(p->pAig, i) );
            Vec_IntForEachEntry( p->vClassTemp, Ent, k )
                Cec_ManSimSimDeref( p, Ent );
        }
    }

    if ( p->pPars->fConstCorr )
    {
        Vec_IntForEachEntry( p->vRefinedC, i, k )
        {
            Gia_ObjSetRepr( p->pAig, i, GIA_VOID );
            Cec_ManSimSimDeref( p, i );
        }
        Vec_IntClear( p->vRefinedC );
    }

    if ( Vec_IntSize(p->vRefinedC) > 0 )
        Cec_ManSimProcessRefined( p, p->vRefinedC );
    assert( vInfoCis == NULL || iCiId == Gia_ManCiNum(p->pAig) );
    assert( vInfoCos == NULL || iCoId == Gia_ManCoNum(p->pAig) );
    assert( p->nMems == 1 );
    if ( p->nMems != 1 )
        Abc_Print( 1, "Cec_ManSimSimulateRound(): Memory management error!\n" );
    if ( p->pPars->fVeryVerbose )
        Gia_ManEquivPrintClasses( p->pAig, 0, Cec_MemUsage(p) );
    if ( p->pBestState )
        Cec_ManSimFindBestPattern( p );
/*
    if ( p->nMems > 1 ) {
        for ( i = 1; i < p->nObjs; i++ )
        if ( p->pSims[i] ) {
            int x = 0;
        }
    }
*/
    return Cec_ManSimAnalyzeOutputs( p );
}